

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpint.c
# Opt level: O2

mp_int * mp_add(mp_int *x,mp_int *y)

{
  mp_int *r;
  ulong uVar1;
  
  uVar1 = y->nw;
  if (y->nw < x->nw) {
    uVar1 = x->nw;
  }
  r = mp_make_sized(uVar1 + 1);
  mp_add_into_internal(r,x,y);
  return r;
}

Assistant:

mp_int *mp_add(mp_int *x, mp_int *y)
{
    mp_int *r = mp_make_sized(size_t_max(x->nw, y->nw) + 1);
    mp_add_into(r, x, y);
    return r;
}